

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pInit;
  Abc_Obj_t *pAVar5;
  int local_44;
  int i;
  Abc_Obj_t *pBuf;
  Abc_Ntk_t *pInitNtk;
  Vec_Ptr_t *vPi;
  Vec_Ptr_t *vBo;
  Abc_Obj_t *pInitObj;
  Abc_Obj_t *pOrigObj;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  pNtk_00 = pManMR->pInitNtk;
  for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,local_44);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsBo(pAVar4), iVar2 != 0)) {
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pAVar4);
      pAVar5 = pFVar1[uVar3].field_1.pred;
      iVar2 = Abc_ObjIsPi(pAVar5);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsPi(pInitObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x2a5,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
      }
      pInit = Abc_NtkCreateNodeBuf(pNtk_00,(Abc_Obj_t *)0x0);
      Abc_FlowRetime_ClearInitToOrig(pInit);
      Abc_ObjBetterTransferFanout(pAVar5,pInit,0);
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pAVar4);
      pFVar1[uVar3].field_1.pred = pInit;
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
      Vec_PtrPush(p,pAVar4);
      Vec_PtrPush(p_00,pAVar5);
    }
  }
  for (local_44 = 0; iVar2 = Abc_NtkPiNum(pNtk_00), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar4 = Abc_NtkPi(pNtk_00,local_44);
    iVar2 = Abc_ObjFanoutNum(pAVar4);
    if (iVar2 != 0) {
      __assert_fail("Abc_ObjFanoutNum( pInitObj ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x2b8,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
    }
  }
  local_44 = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar2 <= local_44) {
      for (local_44 = 0; iVar2 = Vec_PtrSize(p), local_44 < iVar2; local_44 = local_44 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,local_44);
        Abc_FlowRetime_UpdateBackwardInit_rec(pAVar4);
      }
      for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar2; local_44 = local_44 + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_44);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf;
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef;
        }
      }
      Vec_PtrFree(p);
      Vec_PtrFree(p_00);
      return;
    }
    pAVar4 = Abc_NtkBox(pNtk,local_44);
    iVar2 = Abc_ObjIsLatch(pAVar4);
    if (iVar2 != 0) {
      iVar2 = Vec_PtrSize(p_00);
      if (iVar2 < 1) {
        __assert_fail("Vec_PtrSize(vPi) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x2bd,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
      }
      pAVar5 = (Abc_Obj_t *)Vec_PtrPop(p_00);
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffdf | 0x20;
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | 0x10;
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pAVar4);
      pFVar1[uVar3].field_1.pred = pAVar5;
      Abc_ObjSetData(pAVar4,pAVar5);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void Abc_FlowRetime_UpdateBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pOrigObj,  *pInitObj;
  Vec_Ptr_t *vBo = Vec_PtrAlloc(100);
  Vec_Ptr_t *vPi = Vec_PtrAlloc(100);
  Abc_Ntk_t *pInitNtk = pManMR-> pInitNtk;
  Abc_Obj_t *pBuf;
  int i;

  // remove PIs from network (from BOs)
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    if (Abc_ObjIsBo(pOrigObj)) {
      pInitObj = FDATA(pOrigObj)->pInitObj;
      assert(Abc_ObjIsPi(pInitObj));

      // DEBUG
      // printf("update : freeing PI %d\n", pInitObj->Id);
      
      // create a buffer instead
      pBuf = Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pBuf );

      Abc_ObjBetterTransferFanout( pInitObj, pBuf, 0 );
      FDATA(pOrigObj)->pInitObj = pBuf;
      pOrigObj->fMarkA = 1;

      Vec_PtrPush(vBo, pOrigObj);
      Vec_PtrPush(vPi, pInitObj);
    }
  
  // check that PIs are all free
  Abc_NtkForEachPi( pInitNtk, pInitObj, i) {
    assert( Abc_ObjFanoutNum( pInitObj ) == 0);
  }

  // add PIs to to latches
  Abc_NtkForEachLatch( pNtk, pOrigObj, i ) {
    assert(Vec_PtrSize(vPi) > 0);
    pInitObj = (Abc_Obj_t*)Vec_PtrPop(vPi);

    // DEBUG
    // printf("update : mapping latch %d to PI %d\n", pOrigObj->Id, pInitObj->Id);

    pOrigObj->fMarkA = pOrigObj->fMarkB = 1;
    FDATA(pOrigObj)->pInitObj = pInitObj;
    Abc_ObjSetData(pOrigObj, pInitObj);
  }  

  // recursively build init network
  Vec_PtrForEachEntry( Abc_Obj_t *, vBo, pOrigObj, i )
    Abc_FlowRetime_UpdateBackwardInit_rec( pOrigObj );
  
  // clear flags
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    pOrigObj->fMarkA = pOrigObj->fMarkB = 0;

  // deallocate
  Vec_PtrFree( vBo );
  Vec_PtrFree( vPi );
}